

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::focusInEvent(QGraphicsView *this,QFocusEvent *event)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  QGraphicsViewPrivate::updateInputMethodSensitivity(this_00);
  QWidget::focusInEvent((QWidget *)this,event);
  pDVar1 = (this_00->scene).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if ((*(int *)(pDVar1 + 4) != 0) &&
       (pQVar2 = (this_00->scene).wp.value, pQVar2 != (QObject *)0x0)) {
      if (*(int *)(pDVar1 + 4) == 0) {
        pQVar2 = (QObject *)0x0;
      }
      QCoreApplication::sendEvent(pQVar2,(QEvent *)event);
      pDVar1 = (this_00->scene).wp.d;
      if (pDVar1 == (Data *)0x0) goto LAB_00634a2f;
    }
    if (((*(int *)(pDVar1 + 4) != 0) && ((this_00->scene).wp.value != (QObject *)0x0)) &&
       (event[0xc] != (QFocusEvent)0x0)) {
      return;
    }
  }
LAB_00634a2f:
  QWidget::focusInEvent((QWidget *)this,event);
  return;
}

Assistant:

void QGraphicsView::focusInEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    d->updateInputMethodSensitivity();
    QAbstractScrollArea::focusInEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
    // Pass focus on if the scene cannot accept focus.
    if (!d->scene || !event->isAccepted())
        QAbstractScrollArea::focusInEvent(event);
}